

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O3

void __thiscall tst_InsertProxyModel::autoParent(tst_InsertProxyModel *this)

{
  char cVar1;
  QObject *this_00;
  InsertProxyModel *this_01;
  QSignalSpy testItemDestroyedSpy;
  QSignalSpy local_98;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  this_01 = (InsertProxyModel *)operator_new(0x18);
  InsertProxyModel::InsertProxyModel(this_01,this_00);
  QSignalSpy::QSignalSpy(&local_98,(QObject *)this_01,"2destroyed(QObject *)");
  cVar1 = QTest::qVerify(local_98.sig.d.size != 0,"testItemDestroyedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x59);
  if (cVar1 != '\0') {
    (**(code **)(*(long *)this_00 + 0x20))(this_00);
    QTest::qCompare(local_98.super_QList<QList<QVariant>_>.d.size,1,"testItemDestroyedSpy.count()",
                    "1",
                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                    ,0x5b);
  }
  local_98._0_8_ = &PTR_metaObject_0012c890;
  QObject::~QObject((QObject *)((long)&local_98 + 0x58));
  if (&(local_98.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_98.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_98 + 0x10));
  QObject::~QObject(&local_98.super_QObject);
  return;
}

Assistant:

void tst_InsertProxyModel::autoParent()
{
    QObject *parentObj = new QObject;
    auto testItem = new InsertProxyModel(parentObj);
    QSignalSpy testItemDestroyedSpy(testItem, SIGNAL(destroyed(QObject *)));
    QVERIFY(testItemDestroyedSpy.isValid());
    delete parentObj;
    QCOMPARE(testItemDestroyedSpy.count(), 1);
}